

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O2

void __thiscall SNMPPacket::setCommunityString(SNMPPacket *this,string *CommunityString)

{
  __shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>,
             &local_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28._M_refcount);
  std::__cxx11::string::_M_assign((string *)&this->communityString);
  return;
}

Assistant:

void SNMPPacket::setCommunityString(const std::string &CommunityString){
    // poison any cached containers we have
    this->communityStringPtr = nullptr;
    this->communityString = CommunityString;
}